

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_reshape_2d(ggml_context *ctx,ggml_tensor *a,int ne0,int ne1)

{
  int *piVar1;
  undefined1 auVar2 [32];
  undefined4 extraout_EAX;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *extraout_RAX;
  uint uVar6;
  undefined4 in_register_0000000c;
  size_t sVar7;
  uint extraout_EDX;
  uint extraout_EDX_00;
  int32_t value;
  int extraout_EDX_01;
  ggml_tensor *extraout_RDX;
  ggml_tensor *extraout_RDX_00;
  ggml_tensor *extraout_RDX_01;
  ggml_tensor *extraout_RDX_02;
  ggml_tensor *extraout_RDX_03;
  ggml_tensor *tensor;
  uint uVar8;
  ggml_tensor *pgVar9;
  uint uVar10;
  ulong unaff_R12;
  ggml_tensor *unaff_R14;
  ggml_tensor *pgVar11;
  int ne [2];
  int iStack_190;
  int iStack_18c;
  undefined8 uStack_188;
  ggml_tensor *pgStack_178;
  ggml_tensor *pgStack_170;
  ggml_type gStack_168;
  int iStack_164;
  undefined8 uStack_160;
  ggml_tensor *pgStack_150;
  ggml_tensor *pgStack_148;
  undefined4 uStack_140;
  int iStack_13c;
  ggml_tensor *pgStack_138;
  ulong uStack_130;
  ggml_type gStack_d8;
  int iStack_d4;
  ggml_tensor *pgStack_d0;
  ggml_tensor *pgStack_c8;
  ggml_tensor *pgStack_c0;
  undefined1 auStack_b8 [16];
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  ggml_tensor *pgStack_98;
  int iStack_70;
  int iStack_6c;
  undefined8 uStack_68;
  ggml_tensor *pgStack_60;
  int iStack_3c;
  ggml_tensor *pgStack_38;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  ggml_tensor *pgStack_20;
  int local_10;
  int local_c;
  
  pgVar4 = (ggml_tensor *)CONCAT44(in_register_0000000c,ne1);
  pgVar9 = (ggml_tensor *)(ulong)(uint)ne0;
  pgVar3 = (ggml_tensor *)(ulong)a->type;
  if ((((a->nb[0] == GGML_TYPE_SIZE[(long)pgVar3]) &&
       (a->nb[1] == (a->nb[0] * (long)a->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[(long)pgVar3])) &&
      (a->nb[2] == a->nb[1] * (long)a->ne[1])) && (a->nb[3] == a->nb[2] * (long)a->ne[2])) {
    if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] != ne1 * ne0) goto LAB_00120b8c;
    if (a->grad == (ggml_tensor *)0x0) {
      pgStack_20 = (ggml_tensor *)0x120b6c;
      local_10 = ne0;
      local_c = ne1;
      pgVar3 = ggml_new_tensor_impl(ctx,a->type,2,&local_10,a->data);
      pgVar3->op = GGML_OP_RESHAPE;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = a;
      pgVar3->src1 = (ggml_tensor *)0x0;
      return pgVar3;
    }
  }
  else {
    pgStack_20 = (ggml_tensor *)0x120b8c;
    ggml_reshape_2d_cold_1();
LAB_00120b8c:
    pgStack_20 = (ggml_tensor *)0x120b91;
    ggml_reshape_2d_cold_2();
  }
  pgStack_20 = (ggml_tensor *)ggml_reshape_3d;
  ggml_reshape_2d_cold_3();
  pgVar5 = (ggml_tensor *)(ulong)extraout_EDX;
  tensor = (ggml_tensor *)(ulong)pgVar3->type;
  pgStack_20 = a;
  if (((pgVar3->nb[0] == GGML_TYPE_SIZE[(long)tensor]) &&
      (pgVar3->nb[1] ==
       (pgVar3->nb[0] * (long)pgVar3->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[(long)tensor])) &&
     ((pgVar3->nb[2] == pgVar3->nb[1] * (long)pgVar3->ne[1] &&
      (pgVar3->nb[3] == pgVar3->nb[2] * (long)pgVar3->ne[2])))) {
    iStack_28 = (int)pgVar4;
    iStack_24 = (int)pgVar9;
    if (pgVar3->ne[1] * pgVar3->ne[0] * pgVar3->ne[2] * pgVar3->ne[3] !=
        iStack_28 * extraout_EDX * iStack_24) goto LAB_00120c63;
    if (pgVar3->grad == (ggml_tensor *)0x0) {
      pgStack_38 = (ggml_tensor *)0x120c43;
      pgVar4 = ggml_new_tensor_impl(ctx,pgVar3->type,3,&iStack_2c,pgVar3->data);
      pgVar4->op = GGML_OP_RESHAPE;
      pgVar4->grad = (ggml_tensor *)0x0;
      pgVar4->src0 = pgVar3;
      pgVar4->src1 = (ggml_tensor *)0x0;
      return pgVar4;
    }
  }
  else {
    pgStack_38 = (ggml_tensor *)0x120c63;
    ggml_reshape_3d_cold_1();
LAB_00120c63:
    pgStack_38 = (ggml_tensor *)0x120c68;
    ggml_reshape_3d_cold_2();
  }
  pgStack_38 = (ggml_tensor *)ggml_view_1d;
  ggml_reshape_3d_cold_3();
  pgStack_38 = pgVar3;
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl
                       (ctx,tensor->type,1,&iStack_3c,
                        (void *)((long)tensor->data + (long)(pgVar4->ne + -2)));
    pgVar3->op = GGML_OP_VIEW;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_view_1d_cold_1();
  pgStack_60 = pgVar3;
  if (tensor->grad == (ggml_tensor *)0x0) {
    uStack_68 = 0x100000001;
    iStack_6c = (int)pgVar4;
    pgVar3 = ggml_new_tensor_impl
                       (ctx,tensor->type,2,&iStack_70,
                        (void *)((long)tensor->data + (long)(pgVar5->ne + -2)));
    pgVar3->nb[1] = (size_t)pgVar9;
    sVar7 = (long)(int)pgVar4 * (long)pgVar9;
    pgVar3->nb[2] = sVar7;
    pgVar3->nb[3] = sVar7;
    pgVar3->op = GGML_OP_VIEW;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_view_2d_cold_1();
  pgStack_98 = pgVar3;
  if (extraout_EDX_00 < 4) {
    uVar6 = (uint)pgVar4;
    if (3 < uVar6) goto LAB_00120e4d;
    uVar8 = (uint)pgVar9;
    unaff_R14 = (ggml_tensor *)((ulong)pgVar9 & 0xffffffff);
    if (3 < uVar8) goto LAB_00120e52;
    uVar10 = (uint)pgVar5;
    if (3 < uVar10) goto LAB_00120e57;
    unaff_R12 = (ulong)extraout_EDX_00;
    if (extraout_EDX_00 == uVar6) goto LAB_00120e5c;
    if (extraout_EDX_00 == uVar8) goto LAB_00120e61;
    if (extraout_EDX_00 == uVar10) goto LAB_00120e66;
    if (uVar6 == uVar8) goto LAB_00120e6b;
    if (uVar6 == uVar10) goto LAB_00120e70;
    if (uVar8 == uVar10) goto LAB_00120e75;
    pgVar3 = tensor;
    if (tensor->grad == (ggml_tensor *)0x0) {
      pgStack_c0 = (ggml_tensor *)0x120dcb;
      pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
      *(int *)((long)&uStack_a8 + unaff_R12 * 4) = tensor->ne[0];
      *(int *)((long)&uStack_a8 + ((ulong)pgVar4 & 0xffffffff) * 4) = tensor->ne[1];
      *(int *)((long)&uStack_a8 + ((ulong)pgVar9 & 0xffffffff) * 4) = tensor->ne[2];
      *(int *)((long)&uStack_a8 + ((ulong)pgVar5 & 0xffffffff) * 4) = tensor->ne[3];
      *(int *)(auStack_b8 + unaff_R12 * 4) = (int)tensor->nb[0];
      *(int *)(auStack_b8 + ((ulong)pgVar4 & 0xffffffff) * 4) = (int)tensor->nb[1];
      *(int *)(auStack_b8 + ((ulong)pgVar9 & 0xffffffff) * 4) = (int)tensor->nb[2];
      *(int *)(auStack_b8 + ((ulong)pgVar5 & 0xffffffff) * 4) = (int)tensor->nb[3];
      *(undefined8 *)pgVar3->ne = uStack_a8;
      *(undefined8 *)(pgVar3->ne + 2) = uStack_a0;
      auVar2 = vpmovsxdq_avx2(auStack_b8);
      *(undefined1 (*) [32])pgVar3->nb = auVar2;
      pgVar3->op = GGML_OP_PERMUTE;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = (ggml_tensor *)0x0;
      return pgVar3;
    }
  }
  else {
    pgStack_c0 = (ggml_tensor *)0x120e4d;
    ggml_permute_cold_1();
LAB_00120e4d:
    pgStack_c0 = (ggml_tensor *)0x120e52;
    ggml_permute_cold_2();
LAB_00120e52:
    pgStack_c0 = (ggml_tensor *)0x120e57;
    ggml_permute_cold_3();
LAB_00120e57:
    pgStack_c0 = (ggml_tensor *)0x120e5c;
    ggml_permute_cold_4();
LAB_00120e5c:
    pgStack_c0 = (ggml_tensor *)0x120e61;
    ggml_permute_cold_11();
LAB_00120e61:
    pgStack_c0 = (ggml_tensor *)0x120e66;
    ggml_permute_cold_10();
LAB_00120e66:
    pgStack_c0 = (ggml_tensor *)0x120e6b;
    ggml_permute_cold_9();
LAB_00120e6b:
    pgStack_c0 = (ggml_tensor *)0x120e70;
    ggml_permute_cold_8();
LAB_00120e70:
    pgStack_c0 = (ggml_tensor *)0x120e75;
    ggml_permute_cold_7();
LAB_00120e75:
    pgStack_c0 = (ggml_tensor *)0x120e7a;
    ggml_permute_cold_6();
  }
  pgStack_c0 = (ggml_tensor *)ggml_transpose;
  ggml_permute_cold_5();
  pgStack_c0 = pgVar3;
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgStack_c8 = (ggml_tensor *)0x120e9f;
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
    pgVar3->ne[0] = tensor->ne[1];
    pgVar3->ne[1] = tensor->ne[0];
    pgVar3->nb[0] = tensor->nb[1];
    pgVar3->nb[1] = tensor->nb[0];
    pgVar3->op = GGML_OP_TRANSPOSE;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  pgStack_c8 = (ggml_tensor *)ggml_get_rows;
  ggml_transpose_cold_1();
  pgVar11 = unaff_R14;
  pgStack_d0 = pgVar3;
  pgStack_c8 = unaff_R14;
  if (((tensor->ne[2] == 1) && (pgVar11 = tensor, tensor->ne[3] == 1)) &&
     ((pgVar3 = extraout_RDX, extraout_RDX->ne[1] == 1 &&
      (((extraout_RDX->ne[2] == 1 && (extraout_RDX->ne[3] == 1)) &&
       (extraout_RDX->type == GGML_TYPE_I32)))))) {
    if ((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX->grad == (ggml_tensor *)0x0)) {
      _gStack_d8 = CONCAT44(extraout_RDX->ne[0],tensor->ne[0]);
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_d8,(void *)0x0);
      pgVar3->op = GGML_OP_GET_ROWS;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = extraout_RDX;
      return pgVar3;
    }
  }
  else {
    ggml_get_rows_cold_1();
  }
  ggml_get_rows_cold_2();
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
    pgVar4 = ggml_new_i32(ctx,value);
    pgVar3->op = GGML_OP_DIAG_MASK_INF;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = pgVar4;
    return pgVar3;
  }
  ggml_diag_mask_inf_cold_1();
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
    pgVar3->op = GGML_OP_SOFT_MAX;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_soft_max_cold_1();
  pgStack_138 = pgVar3;
  uStack_130 = unaff_R12;
  if (extraout_EDX_01 < 0) {
    pgStack_148 = (ggml_tensor *)0x1210a0;
    ggml_rope_cold_1();
    pgStack_150 = pgVar3;
  }
  else {
    pgStack_150 = tensor;
    if (tensor->grad == (ggml_tensor *)0x0) {
      pgStack_148 = (ggml_tensor *)0x12103d;
      uStack_140 = extraout_EAX;
      pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
      _uStack_140 = CONCAT44(3,uStack_140);
      pgStack_148 = (ggml_tensor *)0x121060;
      pgVar5 = ggml_new_tensor_impl(ctx,GGML_TYPE_I32,1,&iStack_13c,(void *)0x0);
      piVar1 = (int *)pgVar5->data;
      *piVar1 = extraout_EDX_01;
      piVar1[1] = (int)pgVar4;
      piVar1[2] = (int)pgVar9;
      pgVar3->op = GGML_OP_ROPE;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = pgVar5;
      return pgVar3;
    }
  }
  pgStack_148 = (ggml_tensor *)ggml_conv_1d_1s;
  ggml_rope_cold_2();
  pgVar3 = pgStack_150;
  pgStack_148 = pgVar11;
  if ((extraout_RDX_00->ne[2] == 1) && (pgVar3 = extraout_RDX_00, extraout_RDX_00->ne[3] == 1)) {
    pgVar11 = tensor;
    if (tensor->ne[1] != extraout_RDX_00->ne[1]) goto LAB_00121133;
    if (tensor->ne[3] == 1) {
      if ((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_00->grad == (ggml_tensor *)0x0)) {
        gStack_168 = extraout_RDX_00->ne[0];
        iStack_164 = tensor->ne[2];
        uStack_160 = 0x100000001;
        pgStack_170 = (ggml_tensor *)0x12110a;
        pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_168,(void *)0x0);
        pgVar3->op = GGML_OP_CONV_1D_1S;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = tensor;
        pgVar3->src1 = extraout_RDX_00;
        return pgVar3;
      }
      goto LAB_0012112e;
    }
  }
  else {
    pgStack_170 = (ggml_tensor *)0x12112e;
    ggml_conv_1d_1s_cold_1();
LAB_0012112e:
    pgStack_170 = (ggml_tensor *)0x121133;
    ggml_conv_1d_1s_cold_4();
LAB_00121133:
    pgStack_170 = (ggml_tensor *)0x121138;
    ggml_conv_1d_1s_cold_2();
  }
  pgStack_170 = (ggml_tensor *)ggml_conv_1d_2s;
  ggml_conv_1d_1s_cold_3();
  pgStack_178 = pgVar3;
  pgStack_170 = pgVar11;
  if ((extraout_RDX_01->ne[2] == 1) && (extraout_RDX_01->ne[3] == 1)) {
    if (tensor->ne[1] == extraout_RDX_01->ne[1]) {
      if (tensor->ne[3] != 1) goto LAB_001211dd;
      if ((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_01->grad == (ggml_tensor *)0x0)) {
        iStack_190 = extraout_RDX_01->ne[0] / 2;
        iStack_18c = tensor->ne[2];
        uStack_188 = 0x100000001;
        pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&iStack_190,(void *)0x0);
        pgVar3->op = GGML_OP_CONV_1D_2S;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = tensor;
        pgVar3->src1 = extraout_RDX_01;
        return pgVar3;
      }
      goto LAB_001211d3;
    }
  }
  else {
    ggml_conv_1d_2s_cold_1();
LAB_001211d3:
    ggml_conv_1d_2s_cold_4();
  }
  ggml_conv_1d_2s_cold_2();
LAB_001211dd:
  ggml_conv_1d_2s_cold_3();
  if (((extraout_RDX_02->ne[0] == tensor->ne[0]) && (extraout_RDX_02->ne[2] == tensor->ne[2])) &&
     (extraout_RDX_02->ne[3] == tensor->ne[3])) {
    if (((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_02->grad == (ggml_tensor *)0x0)) &&
       (pgVar4->grad == (ggml_tensor *)0x0)) {
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,tensor->ne,(void *)0x0);
      pgVar3->op = GGML_OP_FLASH_ATTN;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = extraout_RDX_02;
      pgVar3->opt[0] = pgVar4;
      pgVar4 = ggml_new_i32(ctx,(uint)pgVar9 & 0xff);
      pgVar3->opt[1] = pgVar4;
      return pgVar3;
    }
  }
  else {
    ggml_flash_attn_cold_1();
  }
  ggml_flash_attn_cold_2();
  if (((extraout_RDX_03->ne[0] == tensor->ne[0]) && (extraout_RDX_03->ne[2] == tensor->ne[2])) &&
     (extraout_RDX_03->ne[3] == tensor->ne[3])) {
    if ((((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_03->grad == (ggml_tensor *)0x0)) &&
        (pgVar4->grad == (ggml_tensor *)0x0)) &&
       ((pgVar9->grad == (ggml_tensor *)0x0 && (pgVar5->grad == (ggml_tensor *)0x0)))) {
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,tensor->ne,(void *)0x0);
      pgVar3->op = GGML_OP_FLASH_FF;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = extraout_RDX_03;
      pgVar3->opt[0] = pgVar4;
      pgVar3->opt[1] = pgVar9;
      pgVar3->opt[2] = pgVar5;
      return pgVar3;
    }
    ggml_flash_ff_cold_2();
  }
  ggml_flash_ff_cold_1();
  tensor->is_param = true;
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,(void *)0x0);
    tensor->grad = pgVar3;
    return pgVar3;
  }
  ggml_set_param_cold_1();
  ggml_build_forward_impl((ggml_cgraph *)ctx,tensor,true);
  return extraout_RAX;
}

Assistant:

struct ggml_tensor * ggml_reshape_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   ne0,
        int                   ne1) {
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_nelements(a) == ne0*ne1);

    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    const int ne[2] = { ne0, ne1 };
    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, 2, ne, a->data);

    result->op   = GGML_OP_RESHAPE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}